

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

int __thiscall
wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::link
          (CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           *this,char *__from,char *__to)

{
  undefined4 in_EAX;
  int iVar1;
  int extraout_EAX;
  value_type local_20;
  BasicBlock *from_local;
  BasicBlock *to_local;
  
  iVar1 = CONCAT31((int3)((uint)in_EAX >> 8),__from == (char *)0x0);
  if (__to != (char *)0x0 && __from != (char *)0x0) {
    local_20 = (value_type)__from;
    from_local = (BasicBlock *)__to;
    std::
    vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::push_back((vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)(__from + 0x48),&from_local);
    std::
    vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::push_back(&from_local->in,&local_20);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void link(BasicBlock* from, BasicBlock* to) {
    if (!from || !to) {
      return; // if one of them is not reachable, ignore
    }
    from->out.push_back(to);
    to->in.push_back(from);
  }